

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_DerefOp_Test::~StatePointer_DerefOp_Test
          (StatePointer_DerefOp_Test *this)

{
  StatePointer_DerefOp_Test *this_local;
  
  ~StatePointer_DerefOp_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StatePointer, DerefOp) {
	int foo1{42};
	int foo2{1337};
	state_ptr<int> p1a{&foo1, 1};
	state_ptr<int> p1b{&foo1, 1};
	state_ptr<int> p2 {&foo2, 1};
	EXPECT_EQ(*p1a, *p1b);
	EXPECT_NE(*p1a, *p2);
	EXPECT_NE(*p1b, *p2);
}